

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkResizeVec(ARKodeMem ark_mem,ARKVecResizeFn resize,void *resize_data,sunindextype lrw_diff,
                sunindextype liw_diff,N_Vector tmpl,N_Vector *v)

{
  int iVar1;
  N_Vector p_Var2;
  char *msgfmt;
  
  p_Var2 = *v;
  if (p_Var2 == (N_Vector)0x0) {
    return 1;
  }
  if (resize == (ARKVecResizeFn)0x0) {
    N_VDestroy(p_Var2);
    *v = (N_Vector)0x0;
    p_Var2 = N_VClone(tmpl);
    *v = p_Var2;
    if (p_Var2 != (N_Vector)0x0) goto LAB_004fc671;
    msgfmt = "Unable to clone vector";
  }
  else {
    iVar1 = (*resize)(p_Var2,tmpl,resize_data);
    if (iVar1 == 0) {
LAB_004fc671:
      ark_mem->lrw = ark_mem->lrw + (long)lrw_diff;
      ark_mem->liw = ark_mem->liw + (long)liw_diff;
      return 1;
    }
    msgfmt = "Error in user-supplied resize() function.";
  }
  arkProcessError(ark_mem,-0x14,"ARKode","arkResizeVec",msgfmt);
  return 0;
}

Assistant:

booleantype arkResizeVec(ARKodeMem ark_mem, ARKVecResizeFn resize,
                         void *resize_data, sunindextype lrw_diff,
                         sunindextype liw_diff, N_Vector tmpl, N_Vector *v)
{
  if (*v != NULL) {
    if (resize == NULL) {
      N_VDestroy(*v);
      *v = NULL;
      *v = N_VClone(tmpl);
      if (*v == NULL) {
        arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                        "arkResizeVec", "Unable to clone vector");
        return(SUNFALSE);
      }
    } else {
      if (resize(*v, tmpl, resize_data)) {
        arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                        "arkResizeVec", MSG_ARK_RESIZE_FAIL);
        return(SUNFALSE);
      }
    }
    ark_mem->lrw += lrw_diff;
    ark_mem->liw += liw_diff;
  }
  return(SUNTRUE);
}